

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O2

Int __thiscall
ipx::LpSolver::CrossoverFromStartingPoint
          (LpSolver *this,double *x_start,double *slack_start,double *y_start,double *z_start)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  pointer piVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  Basis *this_00;
  Int IVar10;
  long lVar11;
  size_t __n;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  Vector colweight;
  Timer timer;
  string local_50;
  
  iVar3 = (this->model_).num_rows_;
  iVar4 = (this->model_).num_cols_;
  ClearSolution(this);
  std::__cxx11::string::string
            ((string *)&local_50,"Crossover from starting point\n",(allocator *)&colweight);
  Control::hLog(&this->control_,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  __n = (long)iVar4 + (long)iVar3;
  std::valarray<double>::resize(&this->x_crossover_,__n,0.0);
  std::valarray<double>::resize(&this->y_crossover_,(long)iVar3,0.0);
  std::valarray<double>::resize(&this->z_crossover_,__n,0.0);
  uVar13 = 0;
  std::valarray<double>::resize(&this->crossover_weights_,0,0.0);
  Model::PresolveStartingPoint
            (&this->model_,x_start,slack_start,y_start,z_start,&this->x_crossover_,
             &this->y_crossover_,&this->z_crossover_);
  pdVar5 = (this->z_crossover_)._M_data;
  uVar12 = 0;
  if (0 < (int)__n) {
    uVar12 = __n & 0xffffffff;
  }
  for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
    dVar14 = (this->x_crossover_)._M_data[uVar13];
    dVar1 = (this->model_).lb_._M_data[uVar13];
    if (dVar14 < dVar1) {
      return 0x69;
    }
    dVar2 = (this->model_).ub_._M_data[uVar13];
    if (dVar2 < dVar14) {
      return 0x69;
    }
    if (((dVar14 != dVar1) || (NAN(dVar14) || NAN(dVar1))) && (0.0 < pdVar5[uVar13])) {
      return 0x69;
    }
    if (((dVar14 != dVar2) || (NAN(dVar14) || NAN(dVar2))) &&
       (pdVar7 = pdVar5 + uVar13, *pdVar7 <= 0.0 && *pdVar7 != 0.0)) {
      return 0x69;
    }
  }
  this_00 = (Basis *)operator_new(0xb0);
  Basis::Basis(this_00,&this->control_,&this->model_);
  std::__uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>::reset
            ((__uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_> *)&this->basis_,this_00)
  ;
  if ((this->control_).parameters_.super_ipx_parameters.crash_basis != 0) {
    Timer::Timer(&timer);
    std::valarray<double>::valarray(&colweight,__n);
    piVar6 = (this->model_).AI_.colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->model_).lb_._M_data;
    pdVar7 = (this->model_).ub_._M_data;
    pdVar8 = (this->z_crossover_)._M_data;
    pdVar9 = (this->x_crossover_)._M_data;
    for (lVar11 = 0; uVar12 * 4 != lVar11; lVar11 = lVar11 + 4) {
      dVar14 = *(double *)((long)pdVar5 + lVar11 * 2);
      dVar1 = *(double *)((long)pdVar7 + lVar11 * 2);
      if ((dVar14 != dVar1) || (NAN(dVar14) || NAN(dVar1))) {
        if (ABS(dVar1) == INFINITY && ABS(dVar14) == INFINITY) {
          *(undefined8 *)((long)colweight._M_data + lVar11 * 2) = 0x7ff0000000000000;
        }
        else {
          dVar2 = *(double *)((long)pdVar8 + lVar11 * 2);
          if ((dVar2 != 0.0) || (NAN(dVar2))) goto LAB_00383404;
          dVar2 = *(double *)((long)pdVar9 + lVar11 * 2);
          iVar4 = iVar3;
          if ((dVar2 != dVar14) || (NAN(dVar2) || NAN(dVar14))) {
            if ((dVar2 != dVar1) || (NAN(dVar2) || NAN(dVar1))) {
              iVar4 = iVar3 * 2;
            }
          }
          *(double *)((long)colweight._M_data + lVar11 * 2) =
               (double)((*(int *)((long)piVar6 + lVar11) - *(int *)((long)piVar6 + lVar11 + 4)) +
                       iVar4 + 1);
        }
      }
      else {
LAB_00383404:
        *(undefined8 *)((long)colweight._M_data + lVar11 * 2) = 0;
      }
    }
    Basis::ConstructBasisFromWeights
              ((this->basis_)._M_t.
               super___uniq_ptr_impl<ipx::Basis,_std::default_delete<ipx::Basis>_>._M_t.
               super__Tuple_impl<0UL,_ipx::Basis_*,_std::default_delete<ipx::Basis>_>.
               super__Head_base<0UL,_ipx::Basis_*,_false>._M_head_impl,colweight._M_data,
               &this->info_);
    dVar14 = Timer::Elapsed(&timer);
    (this->info_).super_ipx_info.time_starting_basis =
         dVar14 + (this->info_).super_ipx_info.time_starting_basis;
    iVar3 = (this->info_).super_ipx_info.errflag;
    if (iVar3 == 0) {
      IVar10 = 0x69;
    }
    else {
      IVar10 = 0;
      ClearSolution(this);
    }
    operator_delete(colweight._M_data);
    if (iVar3 != 0) {
      return IVar10;
    }
  }
  RunCrossover(this);
  return 0;
}

Assistant:

Int LpSolver::CrossoverFromStartingPoint(const double* x_start,
                                         const double* slack_start,
                                         const double* y_start,
                                         const double* z_start) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const Vector& lb = model_.lb();
    const Vector& ub = model_.ub();
    const SparseMatrix& AI = model_.AI();

    ClearSolution();
    control_.hLog("Crossover from starting point\n");

    x_crossover_.resize(n+m);
    y_crossover_.resize(m);
    z_crossover_.resize(n+m);
    crossover_weights_.resize(0);
    model_.PresolveStartingPoint(x_start, slack_start, y_start, z_start,
                                 x_crossover_, y_crossover_, z_crossover_);

    // Check that starting point is complementary and satisfies bound and sign
    // conditions.
    for (Int j = 0; j < n+m; j++) {
        if (x_crossover_[j] < lb[j] || x_crossover_[j] > ub[j])
            return IPX_ERROR_invalid_vector;
        if (x_crossover_[j] != lb[j] && z_crossover_[j] > 0.0)
            return IPX_ERROR_invalid_vector;
        if (x_crossover_[j] != ub[j] && z_crossover_[j] < 0.0)
            return IPX_ERROR_invalid_vector;
    }

    // Construct starting basis.
    basis_.reset(new Basis(control_, model_));
    if (control_.crash_basis()) {
        // Take columns in the following order of priority:
        // - free columns
        // - columns between their bounds, in increasing number of nonzeros
        // - columns with zero dual, in increasing number of nonzeros
        // - Fixed columns and those with nonzero dual
        Timer timer;
        Vector colweight(n+m);
        for (Int j = 0; j < n+m; j++) {
            Int nz = AI.entries(j);
            if (lb[j] == ub[j])
                colweight[j] = 0.0;
            else if (std::isinf(lb[j]) && std::isinf(ub[j]))
                colweight[j] = INFINITY;
            else if (z_crossover_[j] != 0.0)
                colweight[j] = 0.0;
            else if (x_crossover_[j] != lb[j] && x_crossover_[j] != ub[j])
                colweight[j] = m + (m-nz+1);
            else
                colweight[j] = m-nz+1;
        }
        basis_->ConstructBasisFromWeights(&colweight[0], &info_);
        info_.time_starting_basis += timer.Elapsed();
        if (info_.errflag) {
            ClearSolution();
            return 0;
        }
    }

    RunCrossover();
    return 0;
}